

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O0

istream * MinVR::operator>>(istream *is,VRVector3 *v)

{
  istream *piVar1;
  long in_RSI;
  istream *in_RDI;
  char dummy;
  char local_11;
  long local_10;
  
  local_10 = in_RSI;
  piVar1 = std::operator>>(in_RDI,&local_11);
  piVar1 = (istream *)std::istream::operator>>(piVar1,(float *)(local_10 + 8));
  piVar1 = std::operator>>(piVar1,&local_11);
  piVar1 = (istream *)std::istream::operator>>(piVar1,(float *)(local_10 + 0xc));
  piVar1 = std::operator>>(piVar1,&local_11);
  piVar1 = (istream *)std::istream::operator>>(piVar1,(float *)(local_10 + 0x10));
  piVar1 = std::operator>>(piVar1,&local_11);
  return piVar1;
}

Assistant:

std::istream & operator>> ( std::istream &is, VRVector3 &v) {
  // format:  <x, y, z>
  char dummy;
  return is >> dummy >> v.x >> dummy >> v.y >> dummy >> v.z >> dummy;
}